

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParserEntityCheck(xmlParserCtxtPtr ctxt,unsigned_long extra)

{
  xmlParserInputPtr pxVar1;
  xmlEntityPtr pxVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pxVar1 = ctxt->input;
  pxVar2 = pxVar1->entity;
  if ((pxVar2 == (xmlEntityPtr)0x0) || ((pxVar2->flags & 2) == 0)) {
    uVar7 = (long)pxVar1->cur - (long)pxVar1->base;
    uVar3 = 0xffffffffffffffff;
    uVar5 = uVar7 + pxVar1->consumed;
    if (CARRY8(uVar7,pxVar1->consumed)) {
      uVar5 = uVar3;
    }
    uVar7 = uVar5 + ctxt->sizeentities;
    if (CARRY8(uVar5,ctxt->sizeentities)) {
      uVar7 = uVar3;
    }
    puVar4 = &pxVar2->expandedSize;
    if (pxVar2 == (xmlEntityPtr)0x0) {
      puVar4 = &ctxt->sizeentcopy;
    }
    uVar5 = extra + *puVar4;
    if (CARRY8(extra,*puVar4)) {
      uVar5 = uVar3;
    }
    uVar6 = uVar5 + 0x14;
    if (0xffffffffffffffeb < uVar5) {
      uVar6 = uVar3;
    }
    *puVar4 = uVar6;
    if (1000000 < uVar6) {
      if ((uVar6 != 0xffffffffffffffff) && (uVar6 / ctxt->maxAmpl <= uVar7)) {
        return 0;
      }
      xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,
                     "Maximum entity amplification factor exceeded, see xmlCtxtSetMaxAmplification.\n"
                    );
      xmlHaltParser(ctxt);
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
xmlParserEntityCheck(xmlParserCtxtPtr ctxt, unsigned long extra)
{
    unsigned long consumed;
    unsigned long *expandedSize;
    xmlParserInputPtr input = ctxt->input;
    xmlEntityPtr entity = input->entity;

    if ((entity) && (entity->flags & XML_ENT_CHECKED))
        return(0);

    /*
     * Compute total consumed bytes so far, including input streams of
     * external entities.
     */
    consumed = input->consumed;
    xmlSaturatedAddSizeT(&consumed, input->cur - input->base);
    xmlSaturatedAdd(&consumed, ctxt->sizeentities);

    if (entity)
        expandedSize = &entity->expandedSize;
    else
        expandedSize = &ctxt->sizeentcopy;

    /*
     * Add extra cost and some fixed cost.
     */
    xmlSaturatedAdd(expandedSize, extra);
    xmlSaturatedAdd(expandedSize, XML_ENT_FIXED_COST);

    /*
     * It's important to always use saturation arithmetic when tracking
     * entity sizes to make the size checks reliable. If "sizeentcopy"
     * overflows, we have to abort.
     */
    if ((*expandedSize > XML_PARSER_ALLOWED_EXPANSION) &&
        ((*expandedSize >= ULONG_MAX) ||
         (*expandedSize / ctxt->maxAmpl > consumed))) {
        xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity amplification factor exceeded, see "
                       "xmlCtxtSetMaxAmplification.\n");
        xmlHaltParser(ctxt);
        return(1);
    }

    return(0);
}